

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

int lj_cf_table_insert(lua_State *L)

{
  uint64_t uVar1;
  MSize MVar2;
  int iVar3;
  uint uVar4;
  GCtab *t_00;
  TValue *local_d0;
  TValue *local_c8;
  TValue *local_c0;
  TValue *dst_1;
  cTValue *src;
  TValue *dst;
  uint local_98;
  int nargs;
  int32_t i;
  int32_t n;
  GCtab *t;
  lua_State *L_local;
  GCobj *o;
  
  t_00 = lj_lib_checktab(L,1);
  MVar2 = lj_tab_len(t_00);
  local_98 = MVar2 + 1;
  iVar3 = (int)L->top - (int)L->base;
  uVar4 = local_98;
  if (iVar3 != 0x10) {
    if (iVar3 != 0x18) {
      lj_err_caller(L,LJ_ERR_TABINS);
    }
    uVar4 = lj_lib_checkint(L,2);
    for (; (int)uVar4 < (int)local_98; local_98 = local_98 - 1) {
      if (local_98 < t_00->asize) {
        local_c0 = (TValue *)((t_00->array).ptr64 + (long)(int)local_98 * 8);
      }
      else {
        local_c0 = lj_tab_setinth(L,t_00,local_98);
      }
      if (local_98 - 1 < t_00->asize) {
        local_c8 = (TValue *)((t_00->array).ptr64 + (long)(int)(local_98 - 1) * 8);
      }
      else {
        local_c8 = lj_tab_getinth(t_00,local_98 - 1);
      }
      if (local_c8 == (TValue *)0x0) {
        local_c0->u64 = 0xffffffffffffffff;
      }
      else {
        *local_c0 = *local_c8;
      }
    }
  }
  local_98 = uVar4;
  if (local_98 < t_00->asize) {
    local_d0 = (TValue *)((t_00->array).ptr64 + (long)(int)local_98 * 8);
  }
  else {
    local_d0 = lj_tab_setinth(L,t_00,local_98);
  }
  *local_d0 = L->top[-1];
  if (((0xfffffff6 < ((int)(local_d0->field_4).it >> 0xf) + 4U) &&
      ((*(byte *)((local_d0->u64 & 0x7fffffffffff) + 8) & 3) != 0)) && ((t_00->marked & 4) != 0)) {
    uVar1 = (L->glref).ptr64;
    t_00->marked = t_00->marked & 0xfb;
    (t_00->gclist).gcptr64 = *(uint64_t *)(uVar1 + 0x40);
    *(GCtab **)(uVar1 + 0x40) = t_00;
  }
  return 0;
}

Assistant:

LJLIB_CF(table_insert)		LJLIB_REC(.)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = (int32_t)lj_tab_len(t) + 1;
  int nargs = (int)((char *)L->top - (char *)L->base);
  if (nargs != 2*sizeof(TValue)) {
    if (nargs != 3*sizeof(TValue))
      lj_err_caller(L, LJ_ERR_TABINS);
    /* NOBARRIER: This just moves existing elements around. */
    for (n = lj_lib_checkint(L, 2); i > n; i--) {
      /* The set may invalidate the get pointer, so need to do it first! */
      TValue *dst = lj_tab_setint(L, t, i);
      cTValue *src = lj_tab_getint(t, i-1);
      if (src) {
	copyTV(L, dst, src);
      } else {
	setnilV(dst);
      }
    }
    i = n;
  }
  {
    TValue *dst = lj_tab_setint(L, t, i);
    copyTV(L, dst, L->top-1);  /* Set new value. */
    lj_gc_barriert(L, t, dst);
  }
  return 0;
}